

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O0

void __thiscall TaprootSpendData::Merge(TaprootSpendData *this,TaprootSpendData *other)

{
  long lVar1;
  pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int> *ppVar2;
  uchar uVar3;
  uchar uVar4;
  uchar uVar5;
  uchar uVar6;
  uchar uVar7;
  uchar uVar8;
  uchar uVar9;
  bool bVar10;
  reference __k;
  pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  *in_RSI;
  map<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
  *in_RDI;
  long in_FS_OFFSET;
  type *control_blocks;
  type *key;
  map<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
  *__range1;
  iterator __end1;
  iterator __begin1;
  type *in_stack_ffffffffffffffb8;
  _Base_ptr *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar10 = XOnlyPubKey::IsNull((XOnlyPubKey *)in_RSI);
  if ((bVar10) && (bVar10 = XOnlyPubKey::IsNull((XOnlyPubKey *)in_RSI), !bVar10)) {
    ppVar2 = &in_RSI->first;
    uVar3 = *(uchar *)((long)&(ppVar2->first).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start + 1);
    uVar4 = *(uchar *)((long)&(ppVar2->first).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start + 2);
    uVar5 = *(uchar *)((long)&(ppVar2->first).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start + 3);
    uVar6 = *(uchar *)((long)&(ppVar2->first).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start + 4);
    uVar7 = *(uchar *)((long)&(ppVar2->first).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start + 5);
    uVar8 = *(uchar *)((long)&(ppVar2->first).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start + 6);
    uVar9 = *(uchar *)((long)&(ppVar2->first).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start + 7);
    (in_RDI->_M_t)._M_impl.field_0x0 =
         *(uchar *)&(ppVar2->first).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
    (in_RDI->_M_t)._M_impl.field_0x1 = uVar3;
    (in_RDI->_M_t)._M_impl.field_0x2 = uVar4;
    (in_RDI->_M_t)._M_impl.field_0x3 = uVar5;
    (in_RDI->_M_t)._M_impl.field_0x4 = uVar6;
    (in_RDI->_M_t)._M_impl.field_0x5 = uVar7;
    (in_RDI->_M_t)._M_impl.field_0x6 = uVar8;
    (in_RDI->_M_t)._M_impl.field_0x7 = uVar9;
    *(undefined8 *)&(in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header =
         *(undefined8 *)((((base_blob<256U> *)&(in_RSI->first).first)->m_data)._M_elems + 8);
    (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
         *(_Base_ptr *)((((base_blob<256U> *)&(in_RSI->first).first)->m_data)._M_elems + 0x10);
    (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
         *(_Base_ptr *)&(in_RSI->first).second;
  }
  bVar10 = base_blob<256U>::IsNull((base_blob<256U> *)in_stack_ffffffffffffffb8);
  if ((bVar10) &&
     (bVar10 = base_blob<256U>::IsNull((base_blob<256U> *)in_stack_ffffffffffffffb8), !bVar10)) {
    (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
         *(_Base_ptr *)&(in_RSI->second)._M_t._M_impl;
    (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_node_count =
         *(size_t *)&(in_RSI->second)._M_t._M_impl.super__Rb_tree_header._M_header;
    *(_Base_ptr *)&in_RDI[1]._M_t._M_impl =
         (in_RSI->second)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    *(_Base_ptr *)&in_RDI[1]._M_t._M_impl.super__Rb_tree_header._M_header =
         (in_RSI->second)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  this_00 = &(in_RSI->second)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
  std::
  map<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
  ::begin(in_RDI);
  std::
  map<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
  ::end(in_RDI);
  while (bVar10 = std::operator==((_Self *)in_stack_ffffffffffffffb8,(_Self *)in_RDI),
        ((bVar10 ^ 0xffU) & 1) != 0) {
    __k = std::
          _Rb_tree_iterator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
          ::operator*((_Rb_tree_iterator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                       *)in_RSI);
    std::
    get<0ul,std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,int>const,std::set<std::vector<unsigned_char,std::allocator<unsigned_char>>,ShortestVectorFirstComparator,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
              (in_RSI);
    in_stack_ffffffffffffffb8 =
         std::
         get<1ul,std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,int>const,std::set<std::vector<unsigned_char,std::allocator<unsigned_char>>,ShortestVectorFirstComparator,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                   (in_RSI);
    std::
    map<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
    ::operator[]((map<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
                  *)this_00,&__k->first);
    std::
    set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::merge<ShortestVectorFirstComparator>
              ((set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                *)in_RSI,
               (set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                *)0x1a9823a);
    std::
    _Rb_tree_iterator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                  *)in_RSI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void TaprootSpendData::Merge(TaprootSpendData other)
{
    // TODO: figure out how to better deal with conflicting information
    // being merged.
    if (internal_key.IsNull() && !other.internal_key.IsNull()) {
        internal_key = other.internal_key;
    }
    if (merkle_root.IsNull() && !other.merkle_root.IsNull()) {
        merkle_root = other.merkle_root;
    }
    for (auto& [key, control_blocks] : other.scripts) {
        scripts[key].merge(std::move(control_blocks));
    }
}